

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionChecksLatency::RunImpl
          (TestsessionFixtureSessionChecksLatency *this)

{
  TestDetails *details;
  sessionFixtureSessionChecksLatencyHelper fixtureHelper;
  sessionFixtureSessionChecksLatencyHelper local_660;
  
  details = &(this->super_Test).m_details;
  sessionFixtureSessionChecksLatencyHelper::sessionFixtureSessionChecksLatencyHelper
            (&local_660,details);
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionChecksLatencyHelper>
            (&local_660,details);
  sessionFixture::~sessionFixture(&local_660.super_sessionFixture);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionChecksLatency) {
  createSession(1);
  object->setCheckLatency(true);
  CHECK(object->getCheckLatency());
}